

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalToStackPass.cpp
# Opt level: O0

void __thiscall
GlobalToStack::extractValuesFromStore
          (GlobalToStack *this,StoreInst *inst,SmallSetVector<llvm::GlobalVariable_*,_4U> *Vars)

{
  bool bVar1;
  LLVMContext *pLVar2;
  IntegerType *pIVar3;
  ValueParamT Elt;
  Value *Ptr;
  ret_type C;
  undefined1 local_58 [8];
  SmallVector<llvm::Value_*,_4U> Idx;
  Value *V;
  SmallSetVector<llvm::GlobalVariable_*,_4U> *Vars_local;
  StoreInst *inst_local;
  GlobalToStack *this_local;
  
  Idx.super_SmallVectorStorage<llvm::Value_*,_4U>.InlineElts._24_8_ =
       llvm::StoreInst::getValueOperand(inst);
  bVar1 = llvm::isa<llvm::ConstantAggregate,llvm::Value*>
                    ((Value **)(Idx.super_SmallVectorStorage<llvm::Value_*,_4U>.InlineElts + 0x18));
  if (bVar1) {
    llvm::SmallVector<llvm::Value_*,_4U>::SmallVector((SmallVector<llvm::Value_*,_4U> *)local_58);
    llvm::Instruction::getParent((Instruction *)inst);
    pLVar2 = (LLVMContext *)llvm::BasicBlock::getContext();
    pIVar3 = (IntegerType *)llvm::Type::getInt32Ty(pLVar2);
    Elt = (ValueParamT)llvm::ConstantInt::get(pIVar3,0,false);
    llvm::SmallVectorTemplateBase<llvm::Value_*,_true>::push_back
              ((SmallVectorTemplateBase<llvm::Value_*,_true> *)local_58,Elt);
    Ptr = llvm::StoreInst::getPointerOperand(inst);
    C = llvm::cast<llvm::ConstantAggregate,llvm::Value>
                  ((Value *)Idx.super_SmallVectorStorage<llvm::Value_*,_4U>.InlineElts._24_8_);
    disaggregateVars(this,(Instruction *)inst,Ptr,(SmallVectorImpl<llvm::Value_*> *)local_58,C,Vars)
    ;
    llvm::SmallVector<llvm::Value_*,_4U>::~SmallVector((SmallVector<llvm::Value_*,_4U> *)local_58);
  }
  return;
}

Assistant:

void GlobalToStack::extractValuesFromStore(
    StoreInst *inst, SmallSetVector<GlobalVariable *, 4> &Vars) {
  Value *V = inst->getValueOperand();
  if (!isa<ConstantAggregate>(V))
    return;

  SmallVector<Value *, 4> Idx;
  Idx.push_back(
      ConstantInt::get(Type::getInt32Ty(inst->getParent()->getContext()), 0));

  disaggregateVars(inst, inst->getPointerOperand(), Idx,
                   cast<ConstantAggregate>(*V), Vars);
}